

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

void jsondec_field(jsondec *d,upb_Message *msg,upb_MessageDef *m)

{
  upb_MessageValue key;
  _Bool _Var1;
  int iVar2;
  upb_CType uVar3;
  upb_WellKnown uVar4;
  upb_FieldDef *puVar5;
  upb_MessageDef *puVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  upb_OneofDef *puVar10;
  upb_FieldDef *puVar11;
  upb_MutableMessageValue uVar12;
  ulong size;
  upb_StringView uVar13;
  upb_JsonMessageValue val;
  upb_MessageValue local_58;
  byte local_48;
  upb_FieldDef *local_40;
  upb_MutableMessageValue local_38;
  
  if (((ulong)msg->field_0 & 1) != 0) {
    __assert_fail("!upb_Message_IsFrozen(msg)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                  ,0x3b2,"void jsondec_field(jsondec *, upb_Message *, const upb_MessageDef *)");
  }
  uVar13 = jsondec_string(d);
  size = uVar13.size;
  pcVar7 = uVar13.data;
  jsondec_skipws(d);
  jsondec_parselit(d,":");
  if (((size < 2) || (*pcVar7 != '[')) || (pcVar7[size - 1] != ']')) {
    puVar5 = upb_MessageDef_FindByJsonNameWithSize(m,pcVar7,size);
  }
  else {
    puVar5 = upb_DefPool_FindExtensionByNameWithSize(d->symtab,pcVar7 + 1,size - 2);
    if (puVar5 == (upb_FieldDef *)0x0) {
      puVar5 = (upb_FieldDef *)0x0;
    }
    else {
      puVar6 = upb_FieldDef_ContainingType(puVar5);
      if (puVar6 != m) {
        pcVar7 = upb_FieldDef_FullName(puVar5);
        puVar6 = upb_FieldDef_ContainingType(puVar5);
        pcVar8 = upb_MessageDef_FullName(puVar6);
        pcVar9 = upb_MessageDef_FullName(m);
        jsondec_errf(d,"Extension %s extends message %s, but was seen in message %s",pcVar7,pcVar8,
                     pcVar9);
      }
    }
  }
  if (puVar5 == (upb_FieldDef *)0x0) {
    if ((d->options & 1) == 0) {
      jsondec_errf(d,"No such field: %.*s",size & 0xffffffff,pcVar7);
    }
    jsondec_skipval(d);
    return;
  }
  jsondec_skipws(d);
  iVar2 = jsondec_rawpeek(d);
  if (iVar2 == 6) {
    uVar3 = upb_FieldDef_CType(puVar5);
    if (uVar3 == kUpb_CType_Message) {
      puVar6 = upb_FieldDef_MessageSubDef(puVar5);
      uVar4 = upb_MessageDef_WellKnownType(puVar6);
      if (uVar4 == kUpb_WellKnown_Value) goto LAB_002fe366;
    }
    _Var1 = jsondec_isnullvalue(puVar5);
    if (!_Var1) {
      jsondec_parselit(d,"null");
      return;
    }
  }
LAB_002fe366:
  puVar10 = upb_FieldDef_RealContainingOneof(puVar5);
  if (puVar10 != (upb_OneofDef *)0x0) {
    puVar10 = upb_FieldDef_ContainingOneof(puVar5);
    puVar11 = upb_Message_WhichOneofByDef(msg,puVar10);
    if (puVar11 != (upb_FieldDef *)0x0) {
      jsondec_err(d,"More than one field for this oneof.");
    }
  }
  puVar11 = d->debug_field;
  d->debug_field = puVar5;
  _Var1 = upb_FieldDef_IsMap(puVar5);
  if (_Var1) {
    local_40 = puVar11;
    if (((ulong)msg->field_0 & 1) != 0) {
      __assert_fail("!upb_Message_IsFrozen(msg)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                    ,0x387,"void jsondec_map(jsondec *, upb_Message *, const upb_FieldDef *)");
    }
    local_38 = upb_Message_Mutable(msg,puVar5,d->arena);
    puVar6 = upb_FieldDef_MessageSubDef(puVar5);
    puVar5 = upb_MessageDef_FindFieldByNumber(puVar6,1);
    puVar11 = upb_MessageDef_FindFieldByNumber(puVar6,2);
    jsondec_objstart(d);
    _Var1 = jsondec_objnext(d);
    if (_Var1) {
      do {
        jsondec_value((upb_JsonMessageValue *)&local_58.str_val,d,puVar5);
        key = local_58;
        if ((local_48 & 1) != 0) {
          __assert_fail("!key.ignore",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                        ,0x391,"void jsondec_map(jsondec *, upb_Message *, const upb_FieldDef *)");
        }
        jsondec_skipws(d);
        jsondec_parselit(d,":");
        jsondec_value((upb_JsonMessageValue *)&local_58.str_val,d,puVar11);
        if ((local_48 & 1) == 0) {
          upb_Map_Insert(local_38.map,key,local_58,d->arena);
        }
        _Var1 = jsondec_objnext(d);
      } while (_Var1);
    }
    d->depth = d->depth + 1;
    jsondec_wsch(d,'}');
    puVar11 = local_40;
  }
  else {
    _Var1 = upb_FieldDef_IsRepeated(puVar5);
    if (_Var1) {
      if (((ulong)msg->field_0 & 1) != 0) {
        __assert_fail("!upb_Message_IsFrozen(msg)",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                      ,0x379,"void jsondec_array(jsondec *, upb_Message *, const upb_FieldDef *)");
      }
      uVar12 = upb_Message_Mutable(msg,puVar5,d->arena);
      jsondec_arrstart(d);
      _Var1 = jsondec_seqnext(d,']');
      if (_Var1) {
        do {
          jsondec_value((upb_JsonMessageValue *)&local_58.str_val,d,puVar5);
          if (local_48 == 0) {
            upb_Array_Append(uVar12.array,local_58,d->arena);
          }
          _Var1 = jsondec_seqnext(d,']');
        } while (_Var1);
      }
      d->depth = d->depth + 1;
      jsondec_wsch(d,']');
    }
    else {
      _Var1 = upb_FieldDef_IsSubMessage(puVar5);
      if (_Var1) {
        uVar12 = upb_Message_Mutable(msg,puVar5,d->arena);
        puVar6 = upb_FieldDef_MessageSubDef(puVar5);
        jsondec_tomsg(d,uVar12.msg,puVar6);
      }
      else {
        jsondec_value((upb_JsonMessageValue *)&local_58.str_val,d,puVar5);
        if (local_48 == 0) {
          upb_Message_SetFieldByDef(msg,puVar5,local_58,d->arena);
        }
      }
    }
  }
  d->debug_field = puVar11;
  return;
}

Assistant:

static void jsondec_field(jsondec* d, upb_Message* msg,
                          const upb_MessageDef* m) {
  UPB_ASSERT(!upb_Message_IsFrozen(msg));
  upb_StringView name;
  const upb_FieldDef* f;
  const upb_FieldDef* preserved;

  name = jsondec_string(d);
  jsondec_entrysep(d);

  if (name.size >= 2 && name.data[0] == '[' &&
      name.data[name.size - 1] == ']') {
    f = upb_DefPool_FindExtensionByNameWithSize(d->symtab, name.data + 1,
                                                name.size - 2);
    if (f && upb_FieldDef_ContainingType(f) != m) {
      jsondec_errf(
          d, "Extension %s extends message %s, but was seen in message %s",
          upb_FieldDef_FullName(f),
          upb_MessageDef_FullName(upb_FieldDef_ContainingType(f)),
          upb_MessageDef_FullName(m));
    }
  } else {
    f = upb_MessageDef_FindByJsonNameWithSize(m, name.data, name.size);
  }

  if (!f) {
    if ((d->options & upb_JsonDecode_IgnoreUnknown) == 0) {
      jsondec_errf(d, "No such field: " UPB_STRINGVIEW_FORMAT,
                   UPB_STRINGVIEW_ARGS(name));
    }
    jsondec_skipval(d);
    return;
  }

  if (jsondec_peek(d) == JD_NULL && !jsondec_isvalue(f)) {
    /* JSON "null" indicates a default value, so no need to set anything. */
    jsondec_null(d);
    return;
  }

  if (upb_FieldDef_RealContainingOneof(f) &&
      upb_Message_WhichOneofByDef(msg, upb_FieldDef_ContainingOneof(f))) {
    jsondec_err(d, "More than one field for this oneof.");
  }

  preserved = d->debug_field;
  d->debug_field = f;

  if (upb_FieldDef_IsMap(f)) {
    jsondec_map(d, msg, f);
  } else if (upb_FieldDef_IsRepeated(f)) {
    jsondec_array(d, msg, f);
  } else if (upb_FieldDef_IsSubMessage(f)) {
    upb_Message* submsg = upb_Message_Mutable(msg, f, d->arena).msg;
    const upb_MessageDef* subm = upb_FieldDef_MessageSubDef(f);
    jsondec_tomsg(d, submsg, subm);
  } else {
    upb_JsonMessageValue val = jsondec_value(d, f);
    if (!val.ignore) {
      upb_Message_SetFieldByDef(msg, f, val.value, d->arena);
    }
  }

  d->debug_field = preserved;
}